

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domains.c
# Opt level: O1

double * append_domain_coords_face
                   (int dom,int order,double *ptr,int *global_index,int *edges,int *tri,int ntri)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  double dVar5;
  undefined1 auVar4 [16];
  
  if (0 < ntri && order == 3) {
    uVar3 = 0;
    do {
      auVar4 = ZEXT816(0);
      lVar2 = 0;
      do {
        dVar5 = auVar4._8_8_;
        auVar4._0_8_ = auVar4._0_8_ +
                       global_coords[(long)global_index[edges[(long)tri[lVar2] * 2]] * 2] +
                       global_coords[(long)global_index[edges[tri[lVar2] * 2 + 1]] * 2];
        auVar4._8_8_ = dVar5 + global_coords
                               [(long)global_index[edges[(long)tri[lVar2] * 2]] * 2 + 1] +
                       global_coords[(long)global_index[edges[tri[lVar2] * 2 + 1]] * 2 + 1];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      auVar4 = divpd(auVar4,_DAT_00112010);
      uVar1 = ((uint)uVar3 & 3) << 3;
      dVar5 = *(double *)(&DAT_001121a8 + uVar1);
      *ptr = *(double *)(&DAT_00112188 + uVar1) + auVar4._0_8_;
      ptr[1] = dVar5 + auVar4._8_8_;
      ptr = ptr + 2;
      printf("%lg %lg 0. %d\n",(ulong)(uint)dom);
      uVar3 = uVar3 + 1;
      tri = tri + 3;
    } while (uVar3 != (uint)ntri);
  }
  return ptr;
}

Assistant:

double *
append_domain_coords_face(int dom, int order, double *ptr,
                          const int *global_index,
                          const int *edges, const int *tri, int ntri) {
  int i,j,v0,v1;
  double pt[2], xoffset = 0., yoffset = 0., travel = 0.01;
  if(order == 3) {
    for(i = 0; i < ntri; ++i) {
      pt[0] = pt[1] = 0.;
      for(j = 0; j < 3; ++j) {
        /* Current edge in tri*/
        int edge = tri[3*i+j];

        /* vertex indices of edge endpoints */
        v0 = global_index[edges[2*edge]];
        v1 = global_index[edges[2*edge+1]];

        pt[0] += global_coords[v0*2+0];
        pt[1] += global_coords[v0*2+1];
        pt[0] += global_coords[v1*2+0];
        pt[1] += global_coords[v1*2+1];
      }
      /* triangle center. */
      pt[0] /= 6.;
      pt[1] /= 6.;

      switch(i%4) {
      case 0: xoffset = -travel; yoffset = 0.;      break;
      case 1: xoffset = 0.;      yoffset = -travel; break;
      case 2: xoffset = travel;  yoffset = 0.;      break;
      case 3: xoffset = 0.;      yoffset = travel;  break;
      }

      /* perturb the point. */
      pt[0] += xoffset;
      pt[1] += yoffset;

      *ptr++ = pt[0];
      *ptr++ = pt[1];

      /* Print value to Point3D output. */
      printf("%lg %lg 0. %d\n", pt[0],pt[1], dom);
    }
  }
  return ptr;
}